

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

_Bool duckdb_je_arena_boot(sc_data_t *sc_data,base_t *base,_Bool hpa)

{
  uint32_t uVar1;
  _Bool _Var2;
  ulong uVar3;
  uint32_t *puVar4;
  uint32_t uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  div_info_t *div_info;
  
  duckdb_je_arena_dirty_decay_ms_default_set(duckdb_je_opt_dirty_decay_ms);
  duckdb_je_arena_muzzy_decay_ms_default_set(duckdb_je_opt_muzzy_decay_ms);
  div_info = duckdb_je_arena_binind_div_info;
  for (lVar8 = 0; lVar8 != 0xfc; lVar8 = lVar8 + 7) {
    duckdb_je_div_init(div_info,(ulong)(uint)(((&sc_data->sc[0].ndelta)[lVar8] <<
                                              ((byte)(&sc_data->sc[0].lg_delta)[lVar8] & 0x1f)) +
                                             (1 << ((byte)(&sc_data->sc[0].lg_base)[lVar8] & 0x1f)))
                      );
    div_info = div_info + 1;
  }
  uVar3 = (ulong)duckdb_je_bin_info_nbatched_sizes;
  puVar4 = &duckdb_je_bin_infos[0].n_shards;
  uVar5 = 0x134c0;
  for (uVar6 = 0; uVar6 != 0x24; uVar6 = uVar6 + 1) {
    iVar7 = 0x100;
    if (uVar6 < uVar3) {
      iVar7 = 0x288;
    }
    uVar1 = *puVar4;
    duckdb_je_arena_bin_offsets[uVar6] = uVar5;
    uVar5 = uVar5 + iVar7 * uVar1;
    puVar4 = puVar4 + 10;
  }
  _Var2 = duckdb_je_pa_central_init
                    (&duckdb_je_arena_pa_central_global,base,hpa,&duckdb_je_hpa_hooks_default);
  return _Var2;
}

Assistant:

bool
arena_boot(sc_data_t *sc_data, base_t *base, bool hpa) {
	arena_dirty_decay_ms_default_set(opt_dirty_decay_ms);
	arena_muzzy_decay_ms_default_set(opt_muzzy_decay_ms);
	for (unsigned i = 0; i < SC_NBINS; i++) {
		sc_t *sc = &sc_data->sc[i];
		div_init(&arena_binind_div_info[i],
		    (1U << sc->lg_base) + (sc->ndelta << sc->lg_delta));
	}

	JEMALLOC_SUPPRESS_WARN_ON_USAGE(
	uint32_t cur_offset = (uint32_t)offsetof(arena_t, all_bins);
	)
	for (szind_t i = 0; i < SC_NBINS; i++) {
		arena_bin_offsets[i] = cur_offset;
		uint32_t bin_sz = (i < bin_info_nbatched_sizes
		    ? sizeof(bin_with_batch_t) : sizeof(bin_t));
		cur_offset += (uint32_t)bin_infos[i].n_shards * bin_sz;
	}
	return pa_central_init(&arena_pa_central_global, base, hpa,
	    &hpa_hooks_default);
}